

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevT.cpp
# Opt level: O3

void __thiscall OpenMD::ChebyshevT::GenerateFirstTwoTerms(ChebyshevT *this)

{
  mapped_type_conflict *pmVar1;
  DoublePolynomial t1;
  DoublePolynomial t0;
  key_type local_74;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_70;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_40;
  
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl._0_4_ = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       *)&local_40,(key_type *)&local_70);
  *pmVar1 = 1.0;
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            (&this->polyList_,(value_type *)&local_40);
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_74 = 1;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar1 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       *)&local_70,&local_74);
  *pmVar1 = 1.0;
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            (&this->polyList_,(value_type *)&local_70);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_70);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

void ChebyshevT::GenerateFirstTwoTerms() {
    DoublePolynomial t0;
    t0.setCoefficient(0, 1.0);
    polyList_.push_back(t0);

    DoublePolynomial t1;
    t1.setCoefficient(1, 1.0);
    polyList_.push_back(t1);
  }